

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void whereLoopClearUnion(sqlite3 *db,WhereLoop *p)

{
  sqlite3 *in_RSI;
  void *in_stack_ffffffffffffffe8;
  
  if ((in_RSI->nDb & 0x4400U) != 0) {
    if (((in_RSI->nDb & 0x400U) == 0) || (*(char *)((long)&in_RSI->mutex + 4) == '\0')) {
      if (((in_RSI->nDb & 0x4000U) != 0) && (in_RSI->aDb != (Db *)0x0)) {
        sqlite3DbFree(in_RSI,in_stack_ffffffffffffffe8);
        sqlite3DbFreeNN(in_RSI,in_stack_ffffffffffffffe8);
        in_RSI->aDb = (Db *)0x0;
      }
    }
    else {
      sqlite3_free((void *)0x1c6f32);
      *(undefined1 *)((long)&in_RSI->mutex + 4) = 0;
      in_RSI->aDb = (Db *)0x0;
    }
  }
  return;
}

Assistant:

static void whereLoopClearUnion(sqlite3 *db, WhereLoop *p){
  if( p->wsFlags & (WHERE_VIRTUALTABLE|WHERE_AUTO_INDEX) ){
    if( (p->wsFlags & WHERE_VIRTUALTABLE)!=0 && p->u.vtab.needFree ){
      sqlite3_free(p->u.vtab.idxStr);
      p->u.vtab.needFree = 0;
      p->u.vtab.idxStr = 0;
    }else if( (p->wsFlags & WHERE_AUTO_INDEX)!=0 && p->u.btree.pIndex!=0 ){
      sqlite3DbFree(db, p->u.btree.pIndex->zColAff);
      sqlite3DbFreeNN(db, p->u.btree.pIndex);
      p->u.btree.pIndex = 0;
    }
  }
}